

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Own<kj::_::ForkHub<kj::Rc<kj::Refcounted>_>,_kj::_::ForkHubBase> __thiscall
kj::_::PromiseDisposer::
alloc<kj::_::ForkHub<kj::Rc<kj::Refcounted>>,kj::_::ForkHubBase,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
          (PromiseDisposer *this,Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params,
          SourceLocation *params_1)

{
  void *pvVar1;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params_00;
  SourceLocation *params_1_00;
  PromiseArena *arena;
  ForkHub<kj::Rc<kj::Refcounted>_> *ptr;
  SourceLocation *params_local_1;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params_local;
  
  pvVar1 = operator_new(0x400);
  params_00 = fwd<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(params);
  params_1_00 = fwd<kj::SourceLocation&>(params_1);
  ctor<kj::_::ForkHub<kj::Rc<kj::Refcounted>>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
            ((ForkHub<kj::Rc<kj::Refcounted>_> *)((long)pvVar1 + 0x1d8),params_00,params_1_00);
  *(void **)((long)pvVar1 + 0x1e0) = pvVar1;
  Own<kj::_::ForkHub<kj::Rc<kj::Refcounted>_>,_kj::_::ForkHubBase>::Own
            ((Own<kj::_::ForkHub<kj::Rc<kj::Refcounted>_>,_kj::_::ForkHubBase> *)this,
             (ForkHub<kj::Rc<kj::Refcounted>_> *)((long)pvVar1 + 0x1d8));
  return (Own<kj::_::ForkHub<kj::Rc<kj::Refcounted>_>,_kj::_::ForkHubBase>)
         (ForkHub<kj::Rc<kj::Refcounted>_> *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }